

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O0

int lj_ffh_bit_bswap(lua_State *L)

{
  int local_2c;
  uint64_t x;
  lua_State *plStack_18;
  CTypeID id;
  lua_State *L_local;
  
  x._4_4_ = 0;
  plStack_18 = L;
  L_local = (lua_State *)lj_carith_check64(L,1,(CTypeID *)((long)&x + 4));
  if (x._4_4_ == 0) {
    local_2c = 0;
  }
  else {
    local_2c = bit_result64(plStack_18,x._4_4_,
                            (ulong)L_local >> 0x38 | ((ulong)L_local & 0xff000000000000) >> 0x28 |
                            ((ulong)L_local & 0xff0000000000) >> 0x18 |
                            ((ulong)L_local & 0xff00000000) >> 8 |
                            ((ulong)L_local & 0xff000000) << 8 | ((ulong)L_local & 0xff0000) << 0x18
                            | ((ulong)L_local & 0xff00) << 0x28 | (long)L_local << 0x38);
  }
  return local_2c;
}

Assistant:

LJLIB_ASM(bit_bswap)		LJLIB_REC(bit_unary IR_BSWAP)
{
#if LJ_HASFFI
  CTypeID id = 0;
  uint64_t x = lj_carith_check64(L, 1, &id);
  return id ? bit_result64(L, id, lj_bswap64(x)) : FFH_RETRY;
#else
  lj_lib_checknumber(L, 1);
  return FFH_RETRY;
#endif
}